

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

void __thiscall xmrig::Network::Network(Network *this,Controller *controller)

{
  pointer *pppIVar1;
  iterator __position;
  bool hwAES;
  Config *pCVar2;
  CpuConfig *this_00;
  Api *pAVar3;
  IStrategy *pIVar4;
  Timer *this_01;
  IApiListener *local_28;
  
  (this->super_IJobResultListener)._vptr_IJobResultListener = (_func_int **)&PTR__Network_001b0668;
  (this->super_IStrategyListener)._vptr_IStrategyListener = (_func_int **)&DAT_001b06d0;
  (this->super_IBaseListener)._vptr_IBaseListener = (_func_int **)&PTR__Network_001b0718;
  (this->super_ITimerListener)._vptr_ITimerListener = (_func_int **)&PTR__Network_001b0740;
  (this->super_IApiListener)._vptr_IApiListener = (_func_int **)&PTR__Network_001b0768;
  this->m_controller = controller;
  this->m_donate = (IStrategy *)0x0;
  NetworkState::NetworkState(&this->m_state);
  this->m_timer = (Timer *)0x0;
  pCVar2 = Base::config(&controller->super_Base);
  this_00 = Config::cpu(pCVar2);
  hwAES = CpuConfig::isHwAES(this_00);
  JobResults::setListener(&this->super_IJobResultListener,hwAES);
  Base::addListener(&controller->super_Base,&this->super_IBaseListener);
  pAVar3 = Base::api(&controller->super_Base);
  local_28 = &this->super_IApiListener;
  __position._M_current =
       (pAVar3->m_listeners).
       super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pAVar3->m_listeners).
      super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<xmrig::IApiListener*,std::allocator<xmrig::IApiListener*>>::
    _M_realloc_insert<xmrig::IApiListener*const&>
              ((vector<xmrig::IApiListener*,std::allocator<xmrig::IApiListener*>> *)
               &pAVar3->m_listeners,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppIVar1 = &(pAVar3->m_listeners).
                super__Vector_base<xmrig::IApiListener_*,_std::allocator<xmrig::IApiListener_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  pCVar2 = Base::config(&controller->super_Base);
  pIVar4 = Pools::createStrategy(&(pCVar2->super_BaseConfig).m_pools,&this->super_IStrategyListener)
  ;
  this->m_strategy = pIVar4;
  this_01 = (Timer *)operator_new(0x10);
  Timer::Timer(this_01,&this->super_ITimerListener,1000,1000);
  this->m_timer = this_01;
  return;
}

Assistant:

xmrig::Network::Network(Controller *controller) :
    m_controller(controller),
    m_donate(nullptr),
    m_timer(nullptr)
{
    JobResults::setListener(this, controller->config()->cpu().isHwAES());
    controller->addListener(this);

#   ifdef XMRIG_FEATURE_API
    controller->api()->addListener(this);
#   endif

    const Pools &pools = controller->config()->pools();
    m_strategy = pools.createStrategy(this);

    m_timer = new Timer(this, kTickInterval, kTickInterval);
}